

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O2

void get_order_then_remap
               (int size,vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *_edges,
               vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges)

{
  pointer ppVar1;
  int i;
  pair<int,_int> *ppVar2;
  pair<int,_int> *e;
  pointer ppVar3;
  ulong uVar4;
  ulong uVar5;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1;
  pair<int,_int> *e_1;
  pair<int,_int> local_30;
  
  ppVar1 = (_edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  ppVar2 = order;
  for (ppVar3 = (_edges->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1) {
    order[ppVar3->first].second = order[ppVar3->first].second + 1;
    order[ppVar3->second].second = order[ppVar3->second].second + 1;
  }
  uVar4 = 0;
  uVar5 = 0;
  if (0 < size) {
    uVar5 = (ulong)(uint)size;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    ppVar2->first = (int)uVar4;
    ppVar2 = ppVar2 + 1;
  }
  ppVar2 = order;
  std::
  __sort<std::pair<int,int>*,__gnu_cxx::__ops::_Iter_comp_iter<int(*)(std::pair<int,int>const&,std::pair<int,int>const&)>>
            (order,order + size,
             (_Iter_comp_iter<int_(*)(const_std::pair<int,_int>_&,_const_std::pair<int,_int>_&)>)
             0x11853e);
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    ord_map[ppVar2->first] = (int)uVar4;
    ppVar2 = ppVar2 + 1;
  }
  ppVar1 = (_edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (ppVar3 = (_edges->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1) {
    local_30.second = ord_map[ppVar3->second];
    local_30.first = ord_map[ppVar3->first];
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<std::pair<int,int>>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)edges,&local_30);
  }
  return;
}

Assistant:

void get_order_then_remap(int size, const vector<pair<int, int> > &_edges, vector<pair<int, int> > &edges) {
    /* get the order by degree */
    for (auto &e: _edges) {
        ++order[e.first].second;
        ++order[e.second].second;
    }
    for (int i = 0; i < size; ++i) order[i].first = i;
    sort(order, order + size, cmp_order);

    /* remap vertex */
    for (int i = 0; i < size; ++i) ord_map[order[i].first] = i;
    for (auto &e: _edges) {
        edges.push_back(make_pair(ord_map[e.first], ord_map[e.second]));
    }
}